

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::pushNode(OpenGEXImporter *this,aiNode *node,aiScene *pScene)

{
  bool bVar1;
  reference ppaVar2;
  _Base_ptr p_Var3;
  mapped_type *pmVar4;
  pointer ppVar5;
  unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>
  local_70;
  _Self local_68;
  _Self local_60;
  iterator it_1;
  aiNode *parent;
  unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>
  local_40;
  _Self local_38;
  _Self local_30;
  iterator it;
  ChildInfo *info;
  aiScene *pScene_local;
  aiNode *node_local;
  OpenGEXImporter *this_local;
  
  pScene_local = (aiScene *)node;
  node_local = (aiNode *)this;
  if (pScene == (aiScene *)0x0) {
    __assert_fail("nullptr != pScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                  ,0x4ed,"void Assimp::OpenGEX::OpenGEXImporter::pushNode(aiNode *, aiScene *)");
  }
  if (node != (aiNode *)0x0) {
    it._M_node = (_Base_ptr)0x0;
    bVar1 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::empty(&this->m_nodeStack);
    if (bVar1) {
      pScene_local[8].mTextures = (aiTexture **)pScene->mRootNode;
      local_30._M_node =
           (_Base_ptr)
           std::
           map<aiNode_*,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>,_std::less<aiNode_*>,_std::allocator<std::pair<aiNode_*const,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>_>_>_>
           ::find(&this->m_nodeChildMap,(key_type *)&pScene_local[8].mTextures);
      local_38._M_node =
           (_Base_ptr)
           std::
           map<aiNode_*,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>,_std::less<aiNode_*>,_std::allocator<std::pair<aiNode_*const,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>_>_>_>
           ::end(&this->m_nodeChildMap);
      bVar1 = std::operator==(&local_38,&local_30);
      if (bVar1) {
        p_Var3 = (_Base_ptr)operator_new(0x18);
        ChildInfo::ChildInfo((ChildInfo *)p_Var3);
        this->m_root = (ChildInfo *)p_Var3;
        it._M_node = p_Var3;
        std::
        unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>>
        ::unique_ptr<std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>,void>
                  ((unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>>
                    *)&local_40,(pointer)p_Var3);
        pmVar4 = std::
                 map<aiNode_*,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>,_std::less<aiNode_*>,_std::allocator<std::pair<aiNode_*const,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>_>_>_>
                 ::operator[](&this->m_nodeChildMap,(key_type *)&pScene_local[8].mTextures);
        std::
        unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>
        ::operator=(pmVar4,&local_40);
        std::
        unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>
        ::~unique_ptr(&local_40);
      }
      else {
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<aiNode_*const,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>_>_>
                 ::operator->(&local_30);
        it._M_node = (_Base_ptr)
                     std::
                     unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>
                     ::get(&ppVar5->second);
      }
      std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                ((list<aiNode_*,_std::allocator<aiNode_*>_> *)it._M_node,(value_type *)&pScene_local
                );
    }
    else {
      ppaVar2 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::back(&this->m_nodeStack);
      it_1._M_node = (_Base_ptr)*ppaVar2;
      if ((value_type)it_1._M_node == (value_type)0x0) {
        __assert_fail("nullptr != parent",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                      ,0x501,"void Assimp::OpenGEX::OpenGEXImporter::pushNode(aiNode *, aiScene *)")
        ;
      }
      pScene_local[8].mTextures = (aiTexture **)it_1._M_node;
      local_60._M_node =
           (_Base_ptr)
           std::
           map<aiNode_*,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>,_std::less<aiNode_*>,_std::allocator<std::pair<aiNode_*const,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>_>_>_>
           ::find(&this->m_nodeChildMap,(key_type *)&pScene_local[8].mTextures);
      local_68._M_node =
           (_Base_ptr)
           std::
           map<aiNode_*,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>,_std::less<aiNode_*>,_std::allocator<std::pair<aiNode_*const,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>_>_>_>
           ::end(&this->m_nodeChildMap);
      bVar1 = std::operator==(&local_68,&local_60);
      if (bVar1) {
        p_Var3 = (_Base_ptr)operator_new(0x18);
        ChildInfo::ChildInfo((ChildInfo *)p_Var3);
        it._M_node = p_Var3;
        std::
        unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>>
        ::unique_ptr<std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>,void>
                  ((unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>>
                    *)&local_70,(pointer)p_Var3);
        pmVar4 = std::
                 map<aiNode_*,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>,_std::less<aiNode_*>,_std::allocator<std::pair<aiNode_*const,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>_>_>_>
                 ::operator[](&this->m_nodeChildMap,(key_type *)&pScene_local[8].mTextures);
        std::
        unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>
        ::operator=(pmVar4,&local_70);
        std::
        unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>
        ::~unique_ptr(&local_70);
      }
      else {
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<aiNode_*const,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>_>_>
                 ::operator->(&local_60);
        it._M_node = (_Base_ptr)
                     std::
                     unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>
                     ::get(&ppVar5->second);
      }
      std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                ((list<aiNode_*,_std::allocator<aiNode_*>_> *)it._M_node,(value_type *)&pScene_local
                );
    }
    std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
              (&this->m_nodeStack,(value_type *)&pScene_local);
  }
  return;
}

Assistant:

void OpenGEXImporter::pushNode( aiNode *node, aiScene *pScene ) {
    ai_assert( nullptr != pScene );

    if ( nullptr == node ) {
        return;
    }

    ChildInfo *info( nullptr );
    if( m_nodeStack.empty() ) {
        node->mParent = pScene->mRootNode;
        NodeChildMap::iterator it( m_nodeChildMap.find( node->mParent ) );
        if( m_nodeChildMap.end() == it ) {
            info = new ChildInfo;
            m_root = info;
            m_nodeChildMap[ node->mParent ] = std::unique_ptr<ChildInfo>(info);
        } else {
            info = it->second.get();
        }
        info->m_children.push_back( node );
    } else {
        aiNode *parent( m_nodeStack.back() );
        ai_assert( nullptr != parent );
        node->mParent = parent;
        NodeChildMap::iterator it( m_nodeChildMap.find( node->mParent ) );
        if( m_nodeChildMap.end() == it ) {
            info = new ChildInfo;
            m_nodeChildMap[ node->mParent ] = std::unique_ptr<ChildInfo>(info);
        } else {
            info = it->second.get();
        }
        info->m_children.push_back( node );
    }
    m_nodeStack.push_back( node );
}